

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::ParseVarintTest_Varint32_Test::TestBody
          (ParseVarintTest_Varint32_Test *this)

{
  uint value_00;
  uint32_t value;
  uint32_t *__end3;
  uint32_t *__begin3;
  uint32_t (*__range3) [5];
  uint32_t values [5];
  int local_1c;
  uint32_t local_18;
  int varint_length;
  uint32_t base;
  anon_class_1_0_00000001 test_value;
  ParseVarintTest_Varint32_Test *this_local;
  
  local_18 = 0x49;
  _base = this;
  for (local_1c = 1; local_1c < 6; local_1c = local_1c + 1) {
    __range3._0_4_ = local_18 - 0x49;
    __range3._4_4_ = local_18 - 0x48;
    values[0] = local_18;
    values[1] = local_18 + 0x35;
    values[2] = local_18 + 0x36;
    for (__end3 = (uint32_t *)&__range3; __end3 != values + 3; __end3 = __end3 + 1) {
      TestBody::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)((long)&varint_length + 3),*__end3,local_1c);
    }
    local_18 = local_18 * 0x80 + 0x49;
  }
  value_00 = std::numeric_limits<unsigned_int>::max();
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)((long)&varint_length + 3),value_00,5);
  return;
}

Assistant:

TEST(ParseVarintTest, Varint32) {
  auto test_value = [](uint32_t value, int varint_length) {
    uint8_t buffer[10] = {0};
    uint8_t* p = io::CodedOutputStream::WriteVarint32ToArray(value, buffer);
    ASSERT_EQ(p - buffer, varint_length) << "Value = " << value;

    const char* cbuffer = reinterpret_cast<const char*>(buffer);
    uint32_t parsed = ~value;
    const char* r = internal::VarintParse(cbuffer, &parsed);
    ASSERT_EQ(r - cbuffer, varint_length) << "Value = " << value;
    ASSERT_EQ(parsed, value);
  };

  uint32_t base = 73;  // 1001011b
  for (int varint_length = 1; varint_length <= 5; ++varint_length) {
    uint32_t values[] = {
        base - 73, base - 72, base, base + 126 - 73, base + 126 - 72,
    };
    for (uint32_t value : values) {
      test_value(value, varint_length);
    }
    base = (base << 7) + 73;
  }

  test_value(std::numeric_limits<uint32_t>::max(), 5);
}